

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

long boyi_search(char n_w,char n_b,char (*board) [8],char s,char f,long a,long b)

{
  bool bVar1;
  byte s_00;
  char cVar2;
  int iVar3;
  STATE SVar4;
  long lVar5;
  int iVar6;
  char cVar7;
  char n_w_00;
  long lVar8;
  char (*pacVar9) [8];
  STATE s_01;
  char *unaff_R15;
  long lVar10;
  char new_board [8] [8];
  char *local_f0;
  char *local_d0;
  long local_c8;
  char local_a8;
  char *local_a0;
  char (*local_98) [8];
  int (*local_90) [8];
  char (*local_88) [8];
  char local_78 [8];
  char acStack_70 [8];
  char local_68 [8];
  char acStack_60 [8];
  char local_58 [8];
  char acStack_50 [8];
  char local_48 [8];
  char acStack_40 [8];
  
  if ((char)(n_b + n_w) == '@') {
    if (AI_COLOR == 4) {
      lVar10 = 1000000;
      if (n_w <= n_b) {
        lVar10 = 0;
      }
      if (n_w < n_b) {
        return -1000000;
      }
      return lVar10;
    }
    if (AI_COLOR == 5) {
      lVar10 = 1000000;
      if (n_b <= n_w) {
        lVar10 = 0;
      }
      if (n_b < n_w) {
        return -1000000;
      }
      return lVar10;
    }
  }
  if ((MODE_DEPTH[MODE] + chess_num[1] + chess_num[0] <= (int)(char)(n_b + n_w)) &&
     (chess_num[1] + chess_num[0] <= 0x40 - MODE_DEPTH_END[MODE])) {
    return 0;
  }
  s_01 = (STATE)s;
  if (f == '\x01') {
    cVar7 = *(char *)((long)AI_COLOR * 4 + 0x1051b4);
  }
  else {
    lVar10 = 0;
    cVar7 = '\0';
    pacVar9 = board;
    do {
      lVar8 = 0;
      do {
        if (((*pacVar9)[lVar8] & 0xfeU) != 4) {
          iVar3 = canrev((int)lVar10,(int)lVar8,board,s_01,0);
          if (iVar3 < 1) {
            (*pacVar9)[lVar8] = '\0';
          }
          else {
            (*pacVar9)[lVar8] = s + -3;
            cVar7 = cVar7 + '\x01';
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 8);
      lVar10 = lVar10 + 1;
      pacVar9 = pacVar9 + 1;
    } while (lVar10 != 8);
    unaff_R15 = (char *)0x8;
  }
  s_00 = s == '\x04' | 4;
  local_78 = *board;
  acStack_70 = board[1];
  local_68 = board[2];
  acStack_60 = board[3];
  local_58 = board[4];
  acStack_50 = board[5];
  local_48 = board[6];
  acStack_40 = board[7];
  if (cVar7 == '\0') {
    if (f != '\x02') {
      lVar10 = boyi_search(n_w,n_b,&local_78,s_00,'\x02',a,b);
      return lVar10;
    }
    if (AI_COLOR == 4) {
      lVar10 = 1000000;
      if (n_w <= n_b) {
        lVar10 = 0;
      }
      if (n_w < n_b) {
        return -1000000;
      }
      return lVar10;
    }
    if (AI_COLOR == 5) {
      lVar10 = 1000000;
      if (n_b <= n_w) {
        lVar10 = 0;
      }
      if (n_b < n_w) {
        return -1000000;
      }
      return lVar10;
    }
  }
  local_a8 = n_b + '\x01';
  local_c8 = 0;
  local_88 = chessboard;
  local_f0 = local_78;
  local_90 = arg;
  cVar7 = '\0';
  local_a0 = local_f0;
  local_98 = board;
  do {
    lVar10 = 0;
    do {
      if (f == '\x01') {
        if (((*local_88)[lVar10] == 3) || (AI_COLOR + -3 == (int)(*local_88)[lVar10]))
        goto LAB_0010184e;
      }
      else if (s_01 - BOTH == (int)(*local_98)[lVar10]) {
LAB_0010184e:
        iVar3 = canrev((int)local_c8,(int)lVar10,&local_78,s_01,1);
        local_a0[lVar10] = s;
        if (cVar7 != '\0') {
          if (AI_COLOR == s_01) {
            if (a <= (long)unaff_R15) {
              a = (long)unaff_R15;
            }
          }
          else if ((long)unaff_R15 <= b) {
            b = (long)unaff_R15;
          }
        }
        iVar6 = -(*local_90)[lVar10];
        if (AI_COLOR == s_01) {
          iVar6 = (*local_90)[lVar10];
        }
        lVar8 = (long)iVar6;
        cVar2 = (char)iVar3;
        if (s == '\x05') {
          n_w_00 = n_w - cVar2;
          cVar2 = cVar2 + local_a8;
        }
        else {
          n_w_00 = n_w + '\x01' + cVar2;
          cVar2 = n_b - cVar2;
        }
        lVar5 = boyi_search(n_w_00,cVar2,&local_78,s_00,'\0',a - lVar8,b - lVar8);
        unaff_R15 = (char *)(lVar5 + lVar8);
        SVar4 = 9 - AI_COLOR;
        if ((SVar4 == s_01) && ((long)unaff_R15 <= a)) {
          bVar1 = false;
          local_f0 = (char *)a;
        }
        else if ((AI_COLOR == s_01) && (b <= (long)unaff_R15)) {
          bVar1 = false;
          local_f0 = (char *)b;
        }
        else {
          if ((cVar7 == '\0') || ((AI_COLOR == s_01 && ((long)local_d0 < (long)unaff_R15)))) {
            local_d0 = unaff_R15;
            if (f == '\x01') goto LAB_001019a1;
          }
          else {
            bVar1 = (long)unaff_R15 < (long)local_d0;
            if (bVar1 && SVar4 == s_01) {
              local_d0 = unaff_R15;
            }
            if ((f == '\x01') && (bVar1 && SVar4 == s_01)) {
LAB_001019a1:
              boyi_max_x = (int)local_c8;
              boyi_max_y = (int)lVar10;
              local_d0 = unaff_R15;
            }
          }
          cVar7 = cVar7 + '\x01';
          local_78 = *board;
          acStack_70 = board[1];
          local_68 = board[2];
          acStack_60 = board[3];
          local_58 = board[4];
          acStack_50 = board[5];
          local_48 = board[6];
          acStack_40 = board[7];
          bVar1 = true;
        }
        if (!bVar1) {
          return (long)local_f0;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 8);
    local_c8 = local_c8 + 1;
    local_88 = local_88 + 1;
    local_a0 = local_a0 + 8;
    local_98 = local_98 + 1;
    local_90 = local_90 + 1;
    if (local_c8 == 8) {
      return (long)local_d0;
    }
  } while( true );
}

Assistant:

long boyi_search(char n_w, char n_b, char board[][SIZE], char s, char f, long a, long b) {
    char n = n_w + n_b;
    char i, j;
    if (n == SIZE * SIZE) {
        if (AI_COLOR == BLACK) {
            return (n_w > n_b ? -1000000 : (n_w < n_b ? 1000000 : 0));
        }
        if (AI_COLOR == WHITE) {
            return (n_w < n_b ? -1000000 : (n_w > n_b ? 1000000 : 0));
        }
/*#ifdef AI_COLOR_BLACK
		return (n_w > n_b ? -1000000 : (n_w < n_b ? 1000000 : 0));
#endif
#ifdef AI_COLOR_WHITE
		return (n_w < n_b ? -1000000 : (n_w > n_b ? 1000000 : 0));
#endif*/
    }
/*#if (AI_MODE==MODE_EASY)
	if (n >= chess_num[0] + chess_num[1] + 2 && chess_num[0] + chess_num[1] <= SIZE*SIZE - 3)
#elif (AI_MODE==MODE_NORM)
	if (n >= chess_num[0] + chess_num[1] + 5 && chess_num[0] + chess_num[1] <= SIZE*SIZE - 6)
#elif (AI_MODE==MODE_HARD)
	if (n >= chess_num[0] + chess_num[1] + 8 && chess_num[0] + chess_num[1] <= SIZE*SIZE - 12)
#elif (AI_MODE==MODE_HELL)
	if (n >= chess_num[0] + chess_num[1] + 10 && chess_num[0] + chess_num[1] <= SIZE*SIZE - 12)
#endif*/
    if (n >= chess_num[0] + chess_num[1] + MODE_DEPTH[MODE] &&
        chess_num[0] + chess_num[1] <= SIZE * SIZE - MODE_DEPTH_END[MODE]) {
        return 0;
    }
    char num = 0;
    if (f != 1) {
        for (i = 0; i < SIZE; i++) {
            for (j = 0; j < SIZE; j++) {
                if (board[i][j] != WHITE && board[i][j] != BLACK) {
                    if (canrev(i, j, board, s, 0) > 0) {
                        board[i][j] = s - 3;
                        num++;
                    } else {
                        board[i][j] = EMPTY;
                    }
                }
            }
        }
    } else {
        num = num_now[COLOR_bin(AI_COLOR)];
/*#ifdef AI_COLOR_BLACK
		num = num_now[1];
#endif
#ifdef AI_COLOR_WHITE
		num = num_now[0];
#endif*/
    }
    long arg_m;
    char rs = (s == WHITE ? BLACK : WHITE);
    char new_board[SIZE][SIZE];
    memcpy(new_board, board, SIZE * SIZE);
    if (num == 0) {
        if (f == 2) {
            if (AI_COLOR == BLACK) {
                return (n_w > n_b ? -1000000 : (n_w < n_b ? 1000000 : 0));
            }
            if (AI_COLOR == WHITE) {
                return (n_w < n_b ? -1000000 : (n_w > n_b ? 1000000 : 0));
            }
/*#ifdef AI_COLOR_BLACK
			return (n_w > n_b ? -1000000 : (n_w < n_b ? 1000000 : 0));
#endif
#ifdef AI_COLOR_WHITE
			return (n_w < n_b ? -1000000 : (n_w > n_b ? 1000000 : 0));
#endif*/
        } else {
            return boyi_search(n_w, n_b, new_board, rs, 2, a, b);
        }
    }
    num = 0;
    for (i = 0; i < SIZE; i++) {
        for (j = 0; j < SIZE; j++) {
            if (f == 1) {
                if (chessboard[i][j] != COLOR_(AI_COLOR) && chessboard[i][j] != BOTH)
/*#ifdef AI_COLOR_BLACK
				if (chessboard[i][j] != BLACK_&&chessboard[i][j] != BOTH)
#endif
#ifdef AI_COLOR_WHITE
				if (chessboard[i][j] != WHITE_&&chessboard[i][j] != BOTH)
#endif*/
                {
                    continue;
                }
            } else {
                if (board[i][j] != s - 3) {
                    continue;
                }
            }
            char rev = canrev(i, j, new_board, s, 1);
            new_board[i][j] = s;
            long arg_now;
            if (num != 0) {
                if (s == AI_COLOR)
/*#ifdef AI_COLOR_BLACK
				if (s == BLACK)
#endif
#ifdef AI_COLOR_WHITE
				if (s == WHITE)
#endif*/
                {
                    a = max(a, arg_now);
                } else {
                    b = min(b, arg_now);
                }
            }
            long arg_d = getarg(i, j, s);
            if (s == BLACK) {
                arg_now = boyi_search(n_w - rev, n_b + rev + 1, new_board, rs, 0, a - arg_d, b - arg_d) + arg_d;
            } else {
                arg_now = boyi_search(n_w + rev + 1, n_b - rev, new_board, rs, 0, a - arg_d, b - arg_d) + arg_d;
            }
            if (s == COLOR_rev(AI_COLOR) && arg_now <= a)//alpha
/*#ifdef AI_COLOR_BLACK
			if (s == WHITE&&arg_now <= a)//alpha
#endif
#ifdef AI_COLOR_WHITE
			if (s == BLACK&&arg_now <= a)//alpha
#endif*/
            {
                return a;
            }
            if (s == AI_COLOR && arg_now >= b)//beita
/*#ifdef AI_COLOR_BLACK
			if (s == BLACK&&arg_now >= b)//beita
#endif
#ifdef AI_COLOR_WHITE
			if (s == WHITE&&arg_now >= b)//beita
#endif*/
            {
                return b;
            }
            if (num == 0 || s == AI_COLOR && arg_now > arg_m || s == COLOR_rev(AI_COLOR) && arg_now < arg_m)
/*#ifdef AI_COLOR_BLACK
			if (num == 0 || s == BLACK &&arg_now > arg_m || s == WHITE&&arg_now < arg_m)
#endif
#ifdef AI_COLOR_WHITE
			if (num == 0 || s == BLACK &&arg_now < arg_m || s == WHITE&&arg_now > arg_m)
#endif*/
            {
                arg_m = arg_now;
                if (f == 1) {
                    boyi_max_x = i;
                    boyi_max_y = j;
                }
            }
            num++;
            memcpy(new_board, board, SIZE * SIZE);
        }
    }
    return arg_m;
}